

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Params *params)

{
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator>_>
  *psVar1;
  ulong __n;
  int iVar2;
  FieldGenerator *pFVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  FieldGenerator *pFVar7;
  scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator> *psVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  undefined1 uVar12;
  int local_4c;
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator>_>
  *local_48;
  FieldGeneratorMap *local_40;
  Params *local_38;
  
  this->descriptor_ = descriptor;
  iVar2 = *(int *)(descriptor + 0x2c);
  lVar10 = (long)iVar2;
  __n = lVar10 * 8;
  uVar9 = __n + 8;
  if (0xfffffffffffffff7 < __n) {
    uVar9 = 0xffffffffffffffff;
  }
  psVar1 = &this->field_generators_;
  if (lVar10 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_38 = params;
  plVar6 = (long *)operator_new__(uVar9);
  psVar8 = (scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator> *)(plVar6 + 1);
  *plVar6 = lVar10;
  local_40 = this;
  if (lVar10 == 0) {
    psVar1->array_ = psVar8;
  }
  else {
    memset(psVar8,0,__n);
    psVar1->array_ = psVar8;
    local_4c = 0;
    if (0 < iVar2) {
      lVar11 = 0;
      lVar10 = 0;
      uVar5 = 0;
      local_48 = psVar1;
      do {
        pFVar7 = MakeGenerator((FieldDescriptor *)(*(long *)(descriptor + 0x30) + lVar11),local_38,
                               &local_4c);
        uVar4 = uVar5 & 1;
        uVar5 = 1;
        if (uVar4 == 0) {
          uVar5 = (*pFVar7->_vptr_FieldGenerator[2])(pFVar7);
        }
        uVar12 = (undefined1)uVar5;
        psVar8 = internal::
                 scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::javanano::FieldGenerator>_>
                 ::operator[](local_48,lVar10);
        pFVar3 = psVar8->ptr_;
        if (pFVar3 != pFVar7) {
          if (pFVar3 != (FieldGenerator *)0x0) {
            (*pFVar3->_vptr_FieldGenerator[1])();
          }
          psVar8->ptr_ = pFVar7;
        }
        lVar10 = lVar10 + 1;
        lVar11 = lVar11 + 0xa8;
      } while (lVar10 < *(int *)(descriptor + 0x2c));
      goto LAB_002a7eba;
    }
  }
  local_4c = 0;
  uVar12 = false;
LAB_002a7eba:
  local_40->total_bits_ = local_4c;
  local_40->saved_defaults_needed_ = (bool)uVar12;
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(
    const Descriptor* descriptor, const Params &params)
  : descriptor_(descriptor),
    field_generators_(
      new scoped_ptr<FieldGenerator>[descriptor->field_count()]) {

  int next_has_bit_index = 0;
  bool saved_defaults_needed = false;
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    FieldGenerator* field_generator = MakeGenerator(
        descriptor->field(i), params, &next_has_bit_index);
    saved_defaults_needed = saved_defaults_needed
        || field_generator->SavedDefaultNeeded();
    field_generators_[i].reset(field_generator);
  }
  total_bits_ = next_has_bit_index;
  saved_defaults_needed_ = saved_defaults_needed;
}